

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall BailOutInfo::ClearUseOfDst(BailOutInfo *this,SymID id)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  
  if (id == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x97,"(id != SymID_Invalid)","id != SymID_Invalid");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (this->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test(this->byteCodeUpwardExposedUsed,id);
    if (BVar3 != '\0') {
      this->clearedDstByteCodeUpwardExposedUseId = id;
      BVSparse<Memory::JitArenaAllocator>::Clear(this->byteCodeUpwardExposedUsed,id);
      return;
    }
  }
  return;
}

Assistant:

void BailOutInfo::ClearUseOfDst(SymID id)
{
    Assert(id != SymID_Invalid);
    if (this->byteCodeUpwardExposedUsed != nullptr &&
        this->byteCodeUpwardExposedUsed->Test(id))
    {
        this->clearedDstByteCodeUpwardExposedUseId = id;
        this->byteCodeUpwardExposedUsed->Clear(id);
    }
}